

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

void __thiscall xe::ri::SampleList::~SampleList(SampleList *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__SampleList_00151570;
  List::~List(&this->samples);
  (this->sampleInfo).super_Item._vptr_Item = (_func_int **)&PTR__SampleInfo_001515a8;
  List::~List(&(this->sampleInfo).valueInfos);
  pcVar1 = (this->description)._M_dataplus._M_p;
  paVar2 = &(this->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  paVar2 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~SampleList		(void) {}